

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::ELU_x86_avx512::forward_inplace(ELU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  _func_int **pp_Var2;
  bool bVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  long lVar10;
  undefined1 (*pauVar11) [64];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar26 [32];
  undefined1 auVar12 [16];
  undefined1 auVar20 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 extraout_var [60];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  float afVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  float afVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar52 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar17 [16];
  undefined1 auVar25 [32];
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->elempack;
    pp_Var2 = this->_vptr_ELU_x86_avx512;
    auVar27 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    auVar28 = vxorps_avx512dq(auVar27,(undefined1  [64])_ps512_cephes_exp_C1);
    auVar27 = vxorps_avx512dq(auVar27,(undefined1  [64])_ps512_cephes_exp_C2);
    lVar8 = 0;
    auVar29 = vbroadcastss_avx512f(ZEXT416(0xbf800000));
    auVar12 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
    auVar52 = ZEXT1664(auVar12);
    auVar12 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
    auVar53 = ZEXT1664(auVar12);
    auVar20 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
    auVar54 = ZEXT3264(auVar20);
    auVar20 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
    auVar55 = ZEXT3264(auVar20);
    auVar20 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar56 = ZEXT3264(auVar20);
    auVar20 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
    auVar57 = ZEXT3264(auVar20);
    auVar20 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar59 = ZEXT3264(auVar20);
    auVar20 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
    auVar60 = ZEXT3264(auVar20);
    auVar20 = vbroadcastss_avx512vl(ZEXT416(0x395e8083));
    auVar61 = ZEXT3264(auVar20);
    auVar20 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
    auVar62 = ZEXT3264(auVar20);
    auVar20 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
    auVar63 = ZEXT3264(auVar20);
    auVar20 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
    auVar64 = ZEXT3264(auVar20);
    auVar34 = ZEXT3264(CONCAT428(0x3d2aa9c1,
                                 CONCAT424(0x3d2aa9c1,
                                           CONCAT420(0x3d2aa9c1,
                                                     CONCAT416(0x3d2aa9c1,
                                                               CONCAT412(0x3d2aa9c1,
                                                                         CONCAT48(0x3d2aa9c1,
                                                                                  0x3d2aa9c13d2aa9c1
                                                                                 )))))));
    auVar43 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                 CONCAT424(0x3e2aaaaa,
                                           CONCAT420(0x3e2aaaaa,
                                                     CONCAT416(0x3e2aaaaa,
                                                               CONCAT412(0x3e2aaaaa,
                                                                         CONCAT48(0x3e2aaaaa,
                                                                                  0x3e2aaaaa3e2aaaaa
                                                                                 )))))));
    auVar45 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    auVar46 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
    auVar35 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
    auVar37 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
    auVar39 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
    afVar40 = _ps512_1;
    afVar48 = _ps512_cephes_exp_p5;
    do {
      auVar20 = auVar34._0_32_;
      pauVar11 = (undefined1 (*) [64])
                 (bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      auVar34 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd0 + (long)pp_Var2[-3])));
      if ((int)uVar9 < 0x10) {
        uVar7 = 0;
      }
      else {
        iVar5 = 0xf;
        do {
          auVar35 = vmaxps_avx512f(*pauVar11,auVar52);
          auVar37 = vminps_avx512f(*pauVar11,auVar52);
          auVar37 = vminps_avx512f(auVar37,(undefined1  [64])_ps512_exp_hi);
          auVar37 = vmaxps_avx512f(auVar37,(undefined1  [64])_ps512_exp_lo);
          auVar39 = vfmadd213ps_avx512f((undefined1  [64])_ps512_cephes_LOG2EF,auVar37,
                                        (undefined1  [64])afVar48);
          auVar30 = vrndscaleps_avx512f(auVar39,1);
          uVar4 = vcmpps_avx512f(auVar39,auVar30,1);
          auVar39 = vsubps_avx512f(auVar30,(undefined1  [64])afVar40);
          bVar3 = (bool)((byte)uVar4 & 1);
          auVar31._0_4_ = (uint)bVar3 * auVar39._0_4_ | (uint)!bVar3 * auVar30._0_4_;
          bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
          auVar31._4_4_ = (uint)bVar3 * auVar39._4_4_ | (uint)!bVar3 * auVar30._4_4_;
          bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
          auVar31._8_4_ = (uint)bVar3 * auVar39._8_4_ | (uint)!bVar3 * auVar30._8_4_;
          bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
          auVar31._12_4_ = (uint)bVar3 * auVar39._12_4_ | (uint)!bVar3 * auVar30._12_4_;
          bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
          auVar31._16_4_ = (uint)bVar3 * auVar39._16_4_ | (uint)!bVar3 * auVar30._16_4_;
          bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
          auVar31._20_4_ = (uint)bVar3 * auVar39._20_4_ | (uint)!bVar3 * auVar30._20_4_;
          bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
          auVar31._24_4_ = (uint)bVar3 * auVar39._24_4_ | (uint)!bVar3 * auVar30._24_4_;
          bVar3 = (bool)((byte)(uVar4 >> 7) & 1);
          auVar31._28_4_ = (uint)bVar3 * auVar39._28_4_ | (uint)!bVar3 * auVar30._28_4_;
          bVar3 = (bool)((byte)(uVar4 >> 8) & 1);
          auVar31._32_4_ = (uint)bVar3 * auVar39._32_4_ | (uint)!bVar3 * auVar30._32_4_;
          bVar3 = (bool)((byte)(uVar4 >> 9) & 1);
          auVar31._36_4_ = (uint)bVar3 * auVar39._36_4_ | (uint)!bVar3 * auVar30._36_4_;
          bVar3 = (bool)((byte)(uVar4 >> 10) & 1);
          auVar31._40_4_ = (uint)bVar3 * auVar39._40_4_ | (uint)!bVar3 * auVar30._40_4_;
          bVar3 = (bool)((byte)(uVar4 >> 0xb) & 1);
          auVar31._44_4_ = (uint)bVar3 * auVar39._44_4_ | (uint)!bVar3 * auVar30._44_4_;
          bVar3 = (bool)((byte)(uVar4 >> 0xc) & 1);
          auVar31._48_4_ = (uint)bVar3 * auVar39._48_4_ | (uint)!bVar3 * auVar30._48_4_;
          bVar3 = (bool)((byte)(uVar4 >> 0xd) & 1);
          auVar31._52_4_ = (uint)bVar3 * auVar39._52_4_ | (uint)!bVar3 * auVar30._52_4_;
          bVar3 = (bool)((byte)(uVar4 >> 0xe) & 1);
          auVar31._56_4_ = (uint)bVar3 * auVar39._56_4_ | (uint)!bVar3 * auVar30._56_4_;
          bVar3 = SUB81(uVar4 >> 0xf,0);
          auVar31._60_4_ = (uint)bVar3 * auVar39._60_4_ | (uint)!bVar3 * auVar30._60_4_;
          auVar37 = vfmadd231ps_avx512f(auVar37,auVar31,auVar28);
          auVar37 = vfmadd231ps_avx512f(auVar37,auVar31,auVar27);
          auVar39 = vmulps_avx512f(auVar37,auVar37);
          auVar30 = vfmadd132ps_avx512f(auVar37,(undefined1  [64])_ps512_cephes_exp_p1,
                                        (undefined1  [64])_ps512_cephes_exp_p0);
          auVar30 = vfmadd213ps_avx512f(auVar30,auVar37,(undefined1  [64])_ps512_cephes_exp_p2);
          auVar30 = vfmadd213ps_avx512f(auVar30,auVar37,(undefined1  [64])_ps512_cephes_exp_p3);
          auVar30 = vfmadd213ps_avx512f(auVar30,auVar37,(undefined1  [64])_ps512_cephes_exp_p4);
          auVar30 = vfmadd213ps_avx512f(auVar30,auVar37,(undefined1  [64])afVar48);
          auVar37 = vfmadd213ps_avx512f(auVar30,auVar39,auVar37);
          auVar37 = vaddps_avx512f(auVar37,(undefined1  [64])afVar40);
          auVar39 = vcvttps2dq_avx512f(auVar31);
          auVar39 = vpaddd_avx512f(auVar39,(undefined1  [64])_pi32_512_0x7f);
          auVar39 = vpslld_avx512f(auVar39,0x17);
          auVar37 = vfmadd213ps_avx512f(auVar39,auVar37,auVar29);
          auVar35 = vfmadd213ps_avx512f(auVar37,auVar34,auVar35);
          *pauVar11 = auVar35;
          pauVar11 = pauVar11 + 1;
          iVar5 = iVar5 + 0x10;
        } while (iVar5 < (int)uVar9);
        auVar34 = ZEXT464(*(uint *)(&this->field_0xd0 + (long)pp_Var2[-3]));
        auVar20._8_4_ = 0x3d2aa9c1;
        auVar20._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar20._12_4_ = 0x3d2aa9c1;
        auVar20._16_4_ = 0x3d2aa9c1;
        auVar20._20_4_ = 0x3d2aa9c1;
        auVar20._24_4_ = 0x3d2aa9c1;
        auVar20._28_4_ = 0x3d2aa9c1;
        auVar35 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
        auVar37 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
        auVar39 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        uVar7 = uVar9 & 0xfffffff0;
      }
      auVar33._0_4_ = auVar34._0_4_;
      if ((int)(uVar7 | 7) < (int)uVar9) {
        auVar33._4_4_ = auVar33._0_4_;
        auVar33._8_4_ = auVar33._0_4_;
        auVar33._12_4_ = auVar33._0_4_;
        auVar33._16_4_ = auVar33._0_4_;
        auVar33._20_4_ = auVar33._0_4_;
        auVar33._24_4_ = auVar33._0_4_;
        auVar33._28_4_ = auVar33._0_4_;
        uVar6 = uVar7;
        do {
          auVar21 = vmaxps_avx512vl(*(undefined1 (*) [32])*pauVar11,auVar53._0_32_);
          auVar22 = vminps_avx512vl(*(undefined1 (*) [32])*pauVar11,auVar53._0_32_);
          auVar22 = vminps_avx512vl(auVar22,auVar54._0_32_);
          auVar23 = vmaxps_avx512vl(auVar22,auVar55._0_32_);
          auVar24 = vfmadd231ps_avx512vl(auVar56._0_32_,auVar23,auVar57._0_32_);
          auVar22 = vroundps_avx(auVar24,1);
          uVar4 = vcmpps_avx512vl(auVar24,auVar22,1);
          auVar58 = auVar59._0_32_;
          auVar25 = vsubps_avx512vl(auVar22,auVar58);
          bVar3 = (bool)((byte)uVar4 & 1);
          auVar26._0_4_ = (float)((uint)bVar3 * auVar25._0_4_ | (uint)!bVar3 * auVar22._0_4_);
          bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
          auVar26._4_4_ = (float)((uint)bVar3 * auVar25._4_4_ | (uint)!bVar3 * auVar22._4_4_);
          bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
          auVar26._8_4_ = (float)((uint)bVar3 * auVar25._8_4_ | (uint)!bVar3 * auVar22._8_4_);
          bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
          auVar26._12_4_ = (float)((uint)bVar3 * auVar25._12_4_ | (uint)!bVar3 * auVar22._12_4_);
          bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
          auVar26._16_4_ = (float)((uint)bVar3 * auVar25._16_4_ | (uint)!bVar3 * auVar22._16_4_);
          bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
          auVar26._20_4_ = (float)((uint)bVar3 * auVar25._20_4_ | (uint)!bVar3 * auVar22._20_4_);
          bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
          auVar26._24_4_ = (float)((uint)bVar3 * auVar25._24_4_ | (uint)!bVar3 * auVar22._24_4_);
          bVar3 = SUB81(uVar4 >> 7,0);
          auVar26._28_4_ = (float)((uint)bVar3 * auVar25._28_4_ | (uint)!bVar3 * auVar22._28_4_);
          auVar22 = vfmsub231ps_avx512vl(auVar23,auVar26,auVar60._0_32_);
          auVar23 = vfmsub231ps_avx512vl(auVar22,auVar26,auVar61._0_32_);
          auVar22._4_4_ = auVar23._4_4_ * auVar23._4_4_;
          auVar22._0_4_ = auVar23._0_4_ * auVar23._0_4_;
          auVar22._8_4_ = auVar23._8_4_ * auVar23._8_4_;
          auVar22._12_4_ = auVar23._12_4_ * auVar23._12_4_;
          auVar22._16_4_ = auVar23._16_4_ * auVar23._16_4_;
          auVar22._20_4_ = auVar23._20_4_ * auVar23._20_4_;
          auVar22._24_4_ = auVar23._24_4_ * auVar23._24_4_;
          auVar22._28_4_ = auVar24._28_4_;
          auVar24 = vfmadd213ps_avx512vl(auVar62._0_32_,auVar23,auVar63._0_32_);
          auVar24 = vfmadd213ps_avx512vl(auVar24,auVar23,auVar64._0_32_);
          auVar12 = vfmadd213ps_fma(auVar24,auVar23,auVar20);
          auVar12 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar23,auVar43._0_32_);
          auVar24 = vfmadd213ps_avx512vl(ZEXT1632(auVar12),auVar23,auVar56._0_32_);
          auVar12 = vfmadd213ps_fma(auVar24,auVar22,auVar23);
          auVar23 = vaddps_avx512vl(ZEXT1632(auVar12),auVar58);
          auVar24._0_4_ = (int)auVar26._0_4_;
          auVar24._4_4_ = (int)auVar26._4_4_;
          auVar24._8_4_ = (int)auVar26._8_4_;
          auVar24._12_4_ = (int)auVar26._12_4_;
          auVar24._16_4_ = (int)auVar26._16_4_;
          auVar24._20_4_ = (int)auVar26._20_4_;
          auVar24._24_4_ = (int)auVar26._24_4_;
          auVar24._28_4_ = (int)auVar26._28_4_;
          auVar22 = vpslld_avx2(auVar24,0x17);
          auVar22 = vpaddd_avx2(auVar45._0_32_,auVar22);
          auVar22 = vfmsub213ps_avx512vl(auVar22,auVar23,auVar58);
          auVar12 = vfmadd213ps_fma(auVar22,auVar33,auVar21);
          *(undefined1 (*) [32])*pauVar11 = ZEXT1632(auVar12);
          pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x20);
          uVar7 = uVar6 + 8;
          iVar5 = uVar6 + 0xf;
          uVar6 = uVar7;
        } while (iVar5 < (int)uVar9);
        auVar33._0_4_ = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var2[-3]);
        auVar46 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
        auVar35 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
        auVar37 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
        auVar39 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      }
      if ((int)(uVar7 | 3) < (int)uVar9) {
        auVar32._4_4_ = auVar33._0_4_;
        auVar32._0_4_ = auVar33._0_4_;
        auVar32._8_4_ = auVar33._0_4_;
        auVar32._12_4_ = auVar33._0_4_;
        auVar44._8_4_ = 0x3f000000;
        auVar44._0_8_ = 0x3f0000003f000000;
        auVar44._12_4_ = 0x3f000000;
        auVar42._8_4_ = 0x3f318000;
        auVar42._0_8_ = 0x3f3180003f318000;
        auVar42._12_4_ = 0x3f318000;
        auVar41._8_4_ = 0x395e8083;
        auVar41._0_8_ = 0x395e8083395e8083;
        auVar41._12_4_ = 0x395e8083;
        auVar12 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar47._8_4_ = 0x3ab743ce;
        auVar47._0_8_ = 0x3ab743ce3ab743ce;
        auVar47._12_4_ = 0x3ab743ce;
        auVar49._8_4_ = 0x3c088908;
        auVar49._0_8_ = 0x3c0889083c088908;
        auVar49._12_4_ = 0x3c088908;
        auVar50._8_4_ = 0x3d2aa9c1;
        auVar50._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar50._12_4_ = 0x3d2aa9c1;
        auVar13 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar14 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
        in_ZMM18 = ZEXT1664(auVar14);
        auVar51._8_4_ = 0x3f800000;
        auVar51._0_8_ = 0x3f8000003f800000;
        auVar51._12_4_ = 0x3f800000;
        uVar6 = uVar7;
        do {
          auVar15 = vmaxps_avx512vl(*(undefined1 (*) [16])*pauVar11,auVar14);
          auVar16 = vminps_avx512vl(*(undefined1 (*) [16])*pauVar11,auVar14);
          auVar16 = vminps_avx(auVar46._0_16_,auVar16);
          auVar19 = vmaxps_avx(auVar16,auVar35._0_16_);
          auVar18 = vfmadd231ps_fma(auVar44,auVar19,auVar37._0_16_);
          auVar36._0_4_ = (int)auVar18._0_4_;
          auVar36._4_4_ = (int)auVar18._4_4_;
          auVar36._8_4_ = (int)auVar18._8_4_;
          auVar36._12_4_ = (int)auVar18._12_4_;
          auVar16 = vcvtdq2ps_avx(auVar36);
          uVar4 = vcmpps_avx512vl(auVar18,auVar16,1);
          auVar17 = vsubps_avx512vl(auVar16,auVar39._0_16_);
          bVar3 = (bool)((byte)uVar4 & 1);
          auVar18._0_4_ = (float)((uint)bVar3 * auVar17._0_4_ | (uint)!bVar3 * auVar16._0_4_);
          bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
          auVar18._4_4_ = (float)((uint)bVar3 * auVar17._4_4_ | (uint)!bVar3 * auVar16._4_4_);
          bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
          auVar18._8_4_ = (float)((uint)bVar3 * auVar17._8_4_ | (uint)!bVar3 * auVar16._8_4_);
          bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
          auVar18._12_4_ = (float)((uint)bVar3 * auVar17._12_4_ | (uint)!bVar3 * auVar16._12_4_);
          auVar16 = vfmsub231ps_fma(auVar19,auVar18,auVar42);
          auVar19 = vfmsub231ps_fma(auVar16,auVar18,auVar41);
          auVar17._0_4_ = auVar19._0_4_ * auVar19._0_4_;
          auVar17._4_4_ = auVar19._4_4_ * auVar19._4_4_;
          auVar17._8_4_ = auVar19._8_4_ * auVar19._8_4_;
          auVar17._12_4_ = auVar19._12_4_ * auVar19._12_4_;
          auVar16 = vfmadd213ps_fma(auVar12,auVar19,auVar47);
          auVar16 = vfmadd213ps_fma(auVar16,auVar19,auVar49);
          auVar16 = vfmadd213ps_fma(auVar16,auVar19,auVar50);
          auVar16 = vfmadd213ps_avx512vl(auVar16,auVar19,auVar13);
          auVar16 = vfmadd213ps_fma(auVar16,auVar19,auVar44);
          auVar16 = vfmadd213ps_fma(auVar16,auVar17,auVar19);
          auVar19._8_4_ = 0x3f800000;
          auVar19._0_8_ = 0x3f8000003f800000;
          auVar19._12_4_ = 0x3f800000;
          auVar19 = vaddps_avx512vl(auVar16,auVar19);
          auVar38._8_4_ = 0x3f800000;
          auVar38._0_8_ = 0x3f8000003f800000;
          auVar38._12_4_ = 0x3f800000;
          auVar39 = ZEXT1664(auVar38);
          auVar16._0_4_ = (int)auVar18._0_4_;
          auVar16._4_4_ = (int)auVar18._4_4_;
          auVar16._8_4_ = (int)auVar18._8_4_;
          auVar16._12_4_ = (int)auVar18._12_4_;
          auVar37 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
          auVar16 = vpslld_avx(auVar16,0x17);
          auVar16 = vpaddd_avx(auVar51,auVar16);
          auVar16 = vfmsub213ps_fma(auVar16,auVar19,auVar38);
          auVar16 = vfmadd213ps_fma(auVar16,auVar32,auVar15);
          *(undefined1 (*) [16])*pauVar11 = auVar16;
          auVar35 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
          pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x10);
          uVar7 = uVar6 + 4;
          iVar5 = uVar6 + 7;
          uVar6 = uVar7;
        } while (iVar5 < (int)uVar9);
      }
      auVar34 = ZEXT3264(CONCAT428(0x3d2aa9c1,
                                   CONCAT424(0x3d2aa9c1,
                                             CONCAT420(0x3d2aa9c1,
                                                       CONCAT416(0x3d2aa9c1,
                                                                 CONCAT412(0x3d2aa9c1,
                                                                           CONCAT48(0x3d2aa9c1,
                                                                                                                                                                        
                                                  0x3d2aa9c13d2aa9c1)))))));
      auVar43 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                   CONCAT424(0x3e2aaaaa,
                                             CONCAT420(0x3e2aaaaa,
                                                       CONCAT416(0x3e2aaaaa,
                                                                 CONCAT412(0x3e2aaaaa,
                                                                           CONCAT48(0x3e2aaaaa,
                                                                                                                                                                        
                                                  0x3e2aaaaa3e2aaaaa)))))));
      auVar45 = ZEXT3264(CONCAT428(0x3f800000,
                                   CONCAT424(0x3f800000,
                                             CONCAT420(0x3f800000,
                                                       CONCAT416(0x3f800000,
                                                                 CONCAT412(0x3f800000,
                                                                           CONCAT48(0x3f800000,
                                                                                                                                                                        
                                                  0x3f8000003f800000)))))));
      if (uVar9 - uVar7 != 0 && (int)uVar7 <= (int)uVar9) {
        lVar10 = 0;
        do {
          auVar12 = auVar52._0_16_;
          auVar13 = auVar53._0_16_;
          if (*(float *)(*pauVar11 + lVar10 * 4) < 0.0) {
            uVar6 = *(uint *)(&this->field_0xd0 + (long)pp_Var2[-3]);
            auVar30._0_4_ = expf(*(float *)(*pauVar11 + lVar10 * 4));
            afVar48 = _ps512_cephes_exp_p5;
            afVar40 = _ps512_1;
            auVar30._4_60_ = extraout_var;
            auVar39 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
            auVar37 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
            auVar35 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
            auVar46 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
            auVar45 = ZEXT3264(CONCAT428(0x3f800000,
                                         CONCAT424(0x3f800000,
                                                   CONCAT420(0x3f800000,
                                                             CONCAT416(0x3f800000,
                                                                       CONCAT412(0x3f800000,
                                                                                 CONCAT48(0x3f800000
                                                                                          ,
                                                  0x3f8000003f800000)))))));
            auVar43 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                         CONCAT424(0x3e2aaaaa,
                                                   CONCAT420(0x3e2aaaaa,
                                                             CONCAT416(0x3e2aaaaa,
                                                                       CONCAT412(0x3e2aaaaa,
                                                                                 CONCAT48(0x3e2aaaaa
                                                                                          ,
                                                  0x3e2aaaaa3e2aaaaa)))))));
            auVar34 = ZEXT3264(CONCAT428(0x3d2aa9c1,
                                         CONCAT424(0x3d2aa9c1,
                                                   CONCAT420(0x3d2aa9c1,
                                                             CONCAT416(0x3d2aa9c1,
                                                                       CONCAT412(0x3d2aa9c1,
                                                                                 CONCAT48(0x3d2aa9c1
                                                                                          ,
                                                  0x3d2aa9c13d2aa9c1)))))));
            auVar20 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
            auVar64 = ZEXT3264(auVar20);
            auVar20 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
            auVar63 = ZEXT3264(auVar20);
            auVar20 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
            auVar62 = ZEXT3264(auVar20);
            auVar20 = vbroadcastss_avx512vl(ZEXT416(0x395e8083));
            auVar61 = ZEXT3264(auVar20);
            auVar20 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
            auVar60 = ZEXT3264(auVar20);
            auVar20 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar59 = ZEXT3264(auVar20);
            auVar20 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
            auVar57 = ZEXT3264(auVar20);
            auVar20 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
            auVar56 = ZEXT3264(auVar20);
            auVar20 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
            auVar55 = ZEXT3264(auVar20);
            auVar20 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
            auVar54 = ZEXT3264(auVar20);
            auVar13 = vxorps_avx512vl(auVar13,auVar13);
            auVar53 = ZEXT1664(auVar13);
            auVar12 = vxorps_avx512vl(auVar12,auVar12);
            auVar52 = ZEXT1664(auVar12);
            auVar29 = vbroadcastss_avx512f(ZEXT416(0xbf800000));
            auVar12 = vfmsub213ss_fma(auVar30._0_16_,ZEXT416(uVar6),ZEXT416(uVar6));
            *(int *)(*pauVar11 + lVar10 * 4) = auVar12._0_4_;
          }
          lVar10 = lVar10 + 1;
        } while (uVar9 - uVar7 != (int)lVar10);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar1);
  }
  return 0;
}

Assistant:

int ELU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = alpha * (expf(*ptr) - 1.f);
            ptr++;
        }
    }

    return 0;
}